

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterFieldValuePrinter
          (Printer *this,FieldDescriptor *field,FastFieldValuePrinter *printer)

{
  long in_RDX;
  long in_RSI;
  map<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  _Var1;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  pair;
  pointer in_stack_ffffffffffffff88;
  _Base_ptr *this_00;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> *__x;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    this_00 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    __x = &local_40;
    std::make_pair<google::protobuf::FieldDescriptor_const*&,decltype(nullptr)>
              ((FieldDescriptor **)this_00,&in_stack_ffffffffffffff88->_vptr_FastFieldValuePrinter);
    _Var1 = std::
            map<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
            ::insert<std::pair<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>>
                      (in_RDI,__x);
    local_30 = (_Base_ptr)_Var1.first._M_node;
    local_28 = _Var1.second;
    if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_1 = false;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
                    *)0x457812);
      std::
      unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      ::reset((unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
               *)this_00,in_stack_ffffffffffffff88);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool TextFormat::Printer::RegisterFieldValuePrinter(
    const FieldDescriptor* field, const FastFieldValuePrinter* printer) {
  if (field == nullptr || printer == nullptr) {
    return false;
  }
  auto pair = custom_printers_.insert(std::make_pair(field, nullptr));
  if (pair.second) {
    pair.first->second.reset(printer);
    return true;
  } else {
    return false;
  }
}